

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Rep *pRVar2;
  int iVar3;
  
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = this->total_size_;
LAB_0026831f:
    Reserve(this,iVar3 + 1);
  }
  else {
    iVar3 = this->current_size_;
    if (iVar3 == this->total_size_) goto LAB_0026831f;
    iVar1 = pRVar2->allocated_size;
    if (iVar1 == this->total_size_) {
      if (((long *)pRVar2->elements[iVar3] != (long *)0x0) && (this->arena_ == (Arena *)0x0)) {
        (**(code **)(*pRVar2->elements[iVar3] + 8))();
        pRVar2 = this->rep_;
      }
      goto LAB_0026832f;
    }
    if (iVar1 <= iVar3) {
      pRVar2->allocated_size = iVar1 + 1;
      goto LAB_0026832f;
    }
    pRVar2->elements[iVar1] = pRVar2->elements[iVar3];
  }
  pRVar2 = this->rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
LAB_0026832f:
  iVar3 = this->current_size_;
  this->current_size_ = iVar3 + 1;
  pRVar2->elements[iVar3] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(rep_->elements[current_size_]),
                        arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}